

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

void gen_VMLA_sp(TCGContext_conflict1 *tcg_ctx,TCGv_i32 vd,TCGv_i32 vn,TCGv_i32 vm,TCGv_ptr fpst)

{
  TCGv_i32 retval;
  TCGv_i32 tmp;
  TCGv_ptr fpst_local;
  TCGv_i32 vm_local;
  TCGv_i32 vn_local;
  TCGv_i32 vd_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  retval = tcg_temp_new_i32(tcg_ctx);
  gen_helper_vfp_muls(tcg_ctx,retval,vn,vm,fpst);
  gen_helper_vfp_adds(tcg_ctx,vd,vd,retval,fpst);
  tcg_temp_free_i32(tcg_ctx,retval);
  return;
}

Assistant:

static void gen_VMLA_sp(TCGContext *tcg_ctx, TCGv_i32 vd, TCGv_i32 vn, TCGv_i32 vm, TCGv_ptr fpst)
{
    /* Note that order of inputs to the add matters for NaNs */
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);

    gen_helper_vfp_muls(tcg_ctx, tmp, vn, vm, fpst);
    gen_helper_vfp_adds(tcg_ctx, vd, vd, tmp, fpst);
    tcg_temp_free_i32(tcg_ctx, tmp);
}